

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::SymbolicSchema::SymbolicSchema(SymbolicSchema *this,Name *name,NodePtr *link)

{
  Schema *in_RDI;
  Name *in_stack_ffffffffffffff68;
  Node *node;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar1;
  HasName *in_stack_ffffffffffffff88;
  NodeSymbolic *in_stack_ffffffffffffff90;
  
  operator_new(0x68);
  uVar1 = 1;
  concepts::SingleAttribute<avro::Name>::SingleAttribute
            ((SingleAttribute<avro::Name> *)in_RDI,in_stack_ffffffffffffff68);
  node = (Node *)&stack0xffffffffffffff88;
  boost::shared_ptr<avro::Node>::shared_ptr
            ((shared_ptr<avro::Node> *)in_RDI,(shared_ptr<avro::Node> *)node);
  NodeSymbolic::NodeSymbolic
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (NodePtr *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
  Schema::Schema(in_RDI,node);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x220b3f);
  concepts::SingleAttribute<avro::Name>::~SingleAttribute((SingleAttribute<avro::Name> *)0x220b49);
  in_RDI->_vptr_Schema = (_func_int **)&PTR__SymbolicSchema_002664d0;
  return;
}

Assistant:

SymbolicSchema::SymbolicSchema(const Name &name, const NodePtr& link) :
    Schema(new NodeSymbolic(HasName(name), link))
{
}